

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O0

void vkt::BindingModel::anon_unknown_1::TexelBufferRenderInstance::writeDescriptorSetWithTemplate
               (DeviceInterface *vki,VkDevice device,VkDescriptorType descriptorType,
               ShaderInputInterface shaderInterface,VkDescriptorSetLayout layout,
               VkDescriptorPool pool,VkBufferView viewA,VkBufferView viewB,
               VkDescriptorSet descriptorSet,Move<vk::Handle<(vk::HandleType)32>_> *updateTemplate,
               RawUpdateRegistry *updateRegistry,bool withPush,VkPipelineLayout pipelineLayout)

{
  deUint64 dVar1;
  RefData<vk::Handle<(vk::HandleType)32>_> data;
  size_t sVar2;
  size_type sVar3;
  Handle<(vk::HandleType)32> *pHVar4;
  deUint8 *pdVar5;
  Move<vk::Handle<(vk::HandleType)32>_> local_1a8;
  RefData<vk::Handle<(vk::HandleType)32>_> local_188;
  VkDescriptorUpdateTemplateEntryKHR local_168;
  VkDescriptorUpdateTemplateEntryKHR local_148;
  VkDescriptorUpdateTemplateEntryKHR local_128;
  VkDescriptorUpdateTemplateEntryKHR local_108;
  undefined1 local_d8 [8];
  VkDescriptorUpdateTemplateCreateInfoKHR templateCreateInfo;
  vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
  updateEntries;
  VkBufferView texelBufferInfos [2];
  bool withPush_local;
  ShaderInputInterface shaderInterface_local;
  VkDescriptorType descriptorType_local;
  VkDevice device_local;
  DeviceInterface *vki_local;
  VkPipelineLayout pipelineLayout_local;
  VkDescriptorSet descriptorSet_local;
  VkBufferView viewB_local;
  VkBufferView viewA_local;
  VkDescriptorPool pool_local;
  VkDescriptorSetLayout layout_local;
  
  texelBufferInfos[1].m_internal._7_1_ = withPush;
  updateEntries.
  super__Vector_base<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)viewA.m_internal;
  texelBufferInfos[0] = viewB;
  std::
  vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
  ::vector((vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
            *)&templateCreateInfo.set);
  local_d8._0_4_ = VK_STRUCTURE_TYPE_DESCRIPTOR_UPDATE_TEMPLATE_CREATE_INFO_KHR;
  templateCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  templateCreateInfo._4_4_ = 0;
  templateCreateInfo.pNext._0_4_ = 0;
  templateCreateInfo.pNext._4_4_ = 0;
  templateCreateInfo.flags = 0;
  templateCreateInfo.descriptorUpdateEntryCount = 0;
  templateCreateInfo.pDescriptorUpdateEntries._0_4_ = texelBufferInfos[1].m_internal._7_1_ & 1;
  templateCreateInfo.descriptorSetLayout.m_internal._0_4_ = 0;
  templateCreateInfo._48_8_ = pipelineLayout.m_internal;
  templateCreateInfo.pipelineLayout.m_internal._0_4_ = 0;
  templateCreateInfo._32_8_ = layout.m_internal;
  BindingModel::(anonymous_namespace)::RawUpdateRegistry::
  addWriteObject<vk::Handle<(vk::HandleType)12>>
            ((RawUpdateRegistry *)updateRegistry,
             (Handle<(vk::HandleType)12> *)
             &updateEntries.
              super__Vector_base<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  BindingModel::(anonymous_namespace)::RawUpdateRegistry::
  addWriteObject<vk::Handle<(vk::HandleType)12>>
            ((RawUpdateRegistry *)updateRegistry,texelBufferInfos);
  if (shaderInterface == SHADER_INPUT_SINGLE_DESCRIPTOR) {
    sVar2 = RawUpdateRegistry::getWriteObjectOffset(updateRegistry,0);
    createTemplateBinding(&local_108,0,0,1,descriptorType,sVar2,0);
    std::
    vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
    ::push_back((vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
                 *)&templateCreateInfo.set,&local_108);
  }
  else if (shaderInterface == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS) {
    sVar2 = RawUpdateRegistry::getWriteObjectOffset(updateRegistry,0);
    createTemplateBinding(&local_128,0,0,1,descriptorType,sVar2,0);
    std::
    vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
    ::push_back((vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
                 *)&templateCreateInfo.set,&local_128);
    sVar2 = RawUpdateRegistry::getWriteObjectOffset(updateRegistry,1);
    createTemplateBinding(&local_148,1,0,1,descriptorType,sVar2,0);
    std::
    vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
    ::push_back((vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
                 *)&templateCreateInfo.set,&local_148);
  }
  else if (shaderInterface == SHADER_INPUT_DESCRIPTOR_ARRAY) {
    sVar2 = RawUpdateRegistry::getWriteObjectOffset(updateRegistry,0);
    createTemplateBinding(&local_168,0,0,2,descriptorType,sVar2,8);
    std::
    vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
    ::push_back((vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
                 *)&templateCreateInfo.set,&local_168);
  }
  templateCreateInfo._16_8_ =
       std::
       vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
       ::operator[]((vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
                     *)&templateCreateInfo.set,0);
  sVar3 = std::
          vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
          ::size((vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
                  *)&templateCreateInfo.set);
  templateCreateInfo.pNext._4_4_ = (undefined4)sVar3;
  ::vk::createDescriptorUpdateTemplateKHR
            (&local_1a8,vki,device,(VkDescriptorUpdateTemplateCreateInfoKHR *)local_d8,
             (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_188,(Move *)&local_1a8);
  data.deleter.m_deviceIface = local_188.deleter.m_deviceIface;
  data.object.m_internal = local_188.object.m_internal;
  data.deleter.m_device = local_188.deleter.m_device;
  data.deleter.m_allocator = local_188.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)32>_>::operator=(updateTemplate,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)32>_>::~Move(&local_1a8);
  if ((texelBufferInfos[1].m_internal._7_1_ & 1) == 0) {
    pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)32>_>::operator*
                       (&updateTemplate->super_RefBase<vk::Handle<(vk::HandleType)32>_>);
    dVar1 = pHVar4->m_internal;
    pdVar5 = RawUpdateRegistry::getRawPointer(updateRegistry);
    (*vki->_vptr_DeviceInterface[0x92])(vki,device,descriptorSet.m_internal,dVar1,pdVar5);
  }
  std::
  vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
  ::~vector((vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
             *)&templateCreateInfo.set);
  return;
}

Assistant:

void TexelBufferRenderInstance::writeDescriptorSetWithTemplate (const vk::DeviceInterface&						vki,
																vk::VkDevice									device,
																vk::VkDescriptorType							descriptorType,
																ShaderInputInterface							shaderInterface,
																vk::VkDescriptorSetLayout						layout,
																vk::VkDescriptorPool							pool,
																vk::VkBufferView								viewA,
																vk::VkBufferView								viewB,
																vk::VkDescriptorSet								descriptorSet,
																vk::Move<vk::VkDescriptorUpdateTemplateKHR>&	updateTemplate,
																RawUpdateRegistry&								updateRegistry,
																bool											withPush,
																vk::VkPipelineLayout							pipelineLayout)
{
	DE_UNREF(pool);
	const vk::VkBufferView									texelBufferInfos[2]	=
	{
		viewA,
		viewB,
	};
	std::vector<vk::VkDescriptorUpdateTemplateEntryKHR>		updateEntries;
	vk::VkDescriptorUpdateTemplateCreateInfoKHR				templateCreateInfo	=
	{
		vk::VK_STRUCTURE_TYPE_DESCRIPTOR_UPDATE_TEMPLATE_CREATE_INFO_KHR,
		DE_NULL,
		0,
		0,			// updateCount
		DE_NULL,	// pUpdates
		withPush ? vk::VK_DESCRIPTOR_UPDATE_TEMPLATE_TYPE_PUSH_DESCRIPTORS_KHR : vk::VK_DESCRIPTOR_UPDATE_TEMPLATE_TYPE_DESCRIPTOR_SET_KHR,
		layout,
		vk::VK_PIPELINE_BIND_POINT_GRAPHICS,
		pipelineLayout,
		0
	};
	updateRegistry.addWriteObject(texelBufferInfos[0]);
	updateRegistry.addWriteObject(texelBufferInfos[1]);

	switch (shaderInterface)
	{
		case SHADER_INPUT_SINGLE_DESCRIPTOR:
			updateEntries.push_back(createTemplateBinding(0, 0, 1, descriptorType, updateRegistry.getWriteObjectOffset(0), 0));
			break;

		case SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS:
			updateEntries.push_back(createTemplateBinding(0, 0, 1, descriptorType, updateRegistry.getWriteObjectOffset(0), 0));
			updateEntries.push_back(createTemplateBinding(1, 0, 1, descriptorType, updateRegistry.getWriteObjectOffset(1), 0));
			break;

		case SHADER_INPUT_DESCRIPTOR_ARRAY:
			updateEntries.push_back(createTemplateBinding(0, 0, 2, descriptorType, updateRegistry.getWriteObjectOffset(0), sizeof(texelBufferInfos[0])));
			break;

		default:
			DE_FATAL("Impossible");
	}

	templateCreateInfo.pDescriptorUpdateEntries		= &updateEntries[0];
	templateCreateInfo.descriptorUpdateEntryCount	= (deUint32)updateEntries.size();

	updateTemplate									= vk::createDescriptorUpdateTemplateKHR(vki, device, &templateCreateInfo);

	if (!withPush)
	{
		vki.updateDescriptorSetWithTemplateKHR(device, descriptorSet, *updateTemplate, updateRegistry.getRawPointer());
	}
}